

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAndiEa<(moira::Instr)10,(moira::Mode)6,(moira::Size)4>(Moira *this,u16 opcode)

{
  u16 uVar1;
  ushort uVar2;
  u32 addr;
  u32 uVar3;
  u32 uVar4;
  undefined8 in_RAX;
  uint uVar5;
  bool error;
  bool local_31;
  
  local_31 = SUB81((ulong)in_RAX >> 0x38,0);
  uVar1 = (this->queue).irc;
  readExt(this);
  uVar2 = (this->queue).irc;
  readExt(this);
  addr = computeEA<(moira::Mode)6,(moira::Size)4,0ul>(this,opcode & 7);
  uVar3 = readM<(moira::MemSpace)1,(moira::Size)4,128ul>(this,addr,&local_31);
  if (local_31 == false) {
    uVar5 = CONCAT22(uVar1,uVar2) & uVar3;
    (this->reg).sr.n = SUB41(uVar5 >> 0x1f,0);
    (this->reg).sr.z = uVar5 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    uVar4 = (this->reg).pc;
    (this->reg).pc0 = uVar4;
    (this->queue).ird = (this->queue).irc;
    uVar4 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar4 + 2);
    (this->queue).irc = (u16)uVar4;
    writeM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,addr + 2,uVar3 & uVar2);
    writeM<(moira::MemSpace)1,(moira::Size)2,5ul>(this,addr,uVar5 >> 0x10);
  }
  return;
}

Assistant:

void
Moira::execAndiEa(u16 opcode)
{
    u32 ea, data, result;

    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    result = logic<I,S>(src, data);
    prefetch();

    writeOp <M,S, POLLIPL | REVERSE> (dst, ea, result);
}